

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall
Fl_Text_Buffer::select
          (Fl_Text_Buffer *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  int extraout_EAX;
  undefined1 local_24 [8];
  Fl_Text_Selection oldSelection;
  int end_local;
  int start_local;
  Fl_Text_Buffer *this_local;
  
  oldSelection.mEnd = (int)__readfds;
  local_24._0_4_ = (this->mPrimary).mStart;
  local_24._4_4_ = (this->mPrimary).mEnd;
  oldSelection.mStart = *(int *)&(this->mPrimary).mSelected;
  oldSelection._8_4_ = __nfds;
  Fl_Text_Selection::set(&this->mPrimary,__nfds,oldSelection.mEnd);
  redisplay_selection(this,(Fl_Text_Selection *)local_24,&this->mPrimary);
  return extraout_EAX;
}

Assistant:

void Fl_Text_Buffer::select(int start, int end)
{
  IS_UTF8_ALIGNED2(this, (start))
  IS_UTF8_ALIGNED2(this, (end))  
  
  Fl_Text_Selection oldSelection = mPrimary;
  
  mPrimary.set(start, end);
  redisplay_selection(&oldSelection, &mPrimary);
}